

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createStore
          (Builder *this,Id rValue,Id lValue,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  uint memoryAccess_00;
  StorageClass sc;
  MemoryAccessMask MVar1;
  Id id;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  Instruction *local_30;
  Instruction *store;
  Scope local_20;
  uint alignment_local;
  Scope scope_local;
  MemoryAccessMask memoryAccess_local;
  Id lValue_local;
  Id rValue_local;
  Builder *this_local;
  
  store._4_4_ = alignment;
  local_20 = scope;
  alignment_local = memoryAccess;
  scope_local = lValue;
  memoryAccess_local = rValue;
  _lValue_local = this;
  pIVar2 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar2,OpStore);
  local_30 = pIVar2;
  spv::Instruction::reserveOperands(pIVar2,2);
  spv::Instruction::addIdOperand(local_30,scope_local);
  spv::Instruction::addIdOperand(local_30,memoryAccess_local);
  memoryAccess_00 = alignment_local;
  sc = getStorageClass(this,scope_local);
  alignment_local = sanitizeMemoryAccessForStorageClass(this,memoryAccess_00,sc);
  if (alignment_local != MaskNone) {
    spv::Instruction::addImmediateOperand(local_30,alignment_local);
    MVar1 = spv::operator&(alignment_local,Aligned);
    if (MVar1 != MaskNone) {
      spv::Instruction::addImmediateOperand(local_30,store._4_4_);
    }
    MVar1 = spv::operator&(alignment_local,MakePointerAvailable);
    pIVar2 = local_30;
    if (MVar1 != MaskNone) {
      id = makeUintConstant(this,local_20,false);
      spv::Instruction::addIdOperand(pIVar2,id);
    }
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  addInstruction(this,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  return;
}

Assistant:

void Builder::createStore(Id rValue, Id lValue, spv::MemoryAccessMask memoryAccess, spv::Scope scope,
    unsigned int alignment)
{
    Instruction* store = new Instruction(OpStore);
    store->reserveOperands(2);
    store->addIdOperand(lValue);
    store->addIdOperand(rValue);

    memoryAccess = sanitizeMemoryAccessForStorageClass(memoryAccess, getStorageClass(lValue));

    if (memoryAccess != MemoryAccessMaskNone) {
        store->addImmediateOperand(memoryAccess);
        if (memoryAccess & spv::MemoryAccessAlignedMask) {
            store->addImmediateOperand(alignment);
        }
        if (memoryAccess & spv::MemoryAccessMakePointerAvailableKHRMask) {
            store->addIdOperand(makeUintConstant(scope));
        }
    }

    addInstruction(std::unique_ptr<Instruction>(store));
}